

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeMemoryInit(TranslateToFuzzReader *this)

{
  string_view segment_00;
  Index IVar1;
  Index x;
  size_type sVar2;
  reference pvVar3;
  pointer pDVar4;
  Expression *dest_00;
  Const *offset_00;
  Const *size_00;
  reference this_00;
  pointer pMVar5;
  Expression *size;
  Expression *offset;
  Expression *dest;
  size_t sizeVal;
  size_t offsetVal;
  size_t totalSize;
  Name segment;
  Type TStack_20;
  Index segIdx;
  TranslateToFuzzReader *local_18;
  TranslateToFuzzReader *this_local;
  
  local_18 = this;
  if ((this->allowMemory & 1U) == 0) {
    Type::Type(&stack0xffffffffffffffe0,none);
    this_local = (TranslateToFuzzReader *)makeTrivial(this,TStack_20);
  }
  else {
    sVar2 = std::
            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ::size(&this->wasm->dataSegments);
    IVar1 = upTo(this,(Index)sVar2);
    pvVar3 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::operator[](&this->wasm->dataSegments,(ulong)IVar1);
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (pvVar3);
    segment_00 = (pDVar4->super_Named).name.super_IString.str;
    pvVar3 = std::
             vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ::operator[](&this->wasm->dataSegments,(ulong)IVar1);
    pDVar4 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                       (pvVar3);
    sVar2 = std::vector<char,_std::allocator<char>_>::size(&pDVar4->data);
    IVar1 = upTo(this,(Index)sVar2);
    x = upTo(this,(Index)sVar2 - IVar1);
    dest_00 = makePointer(this);
    offset_00 = Builder::makeConst<int>(&this->builder,IVar1);
    size_00 = Builder::makeConst<int>(&this->builder,x);
    this_00 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[](&this->wasm->memories,0);
    pMVar5 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(this_00);
    this_local = (TranslateToFuzzReader *)
                 Builder::makeMemoryInit
                           (&this->builder,(Name)segment_00,dest_00,(Expression *)offset_00,
                            (Expression *)size_00,
                            (Name)(pMVar5->super_Importable).super_Named.name.super_IString.str);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::makeMemoryInit() {
  if (!allowMemory) {
    return makeTrivial(Type::none);
  }
  Index segIdx = upTo(wasm.dataSegments.size());
  Name segment = wasm.dataSegments[segIdx]->name;
  size_t totalSize = wasm.dataSegments[segIdx]->data.size();
  size_t offsetVal = upTo(totalSize);
  size_t sizeVal = upTo(totalSize - offsetVal);
  Expression* dest = makePointer();
  Expression* offset = builder.makeConst(int32_t(offsetVal));
  Expression* size = builder.makeConst(int32_t(sizeVal));
  return builder.makeMemoryInit(
    segment, dest, offset, size, wasm.memories[0]->name);
}